

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_OverlayFlags(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  uint uVar2;
  int iVar3;
  DObject *this;
  bool bVar4;
  DPSprite *pDVar5;
  char *pcVar6;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_004c785b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_004c76e0:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar4 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c785b;
        }
      }
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_004c77d3;
          this = (DObject *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (this != (DObject *)0x0) {
              bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
              if (!bVar4) {
                pcVar6 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_004c785b;
              }
            }
          }
          else if (this != (DObject *)0x0) goto LAB_004c77d3;
        }
        if (2 < (uint)numparam) {
          VVar1 = param[2].field_0.field_3.Type;
          if ((VVar1 != 0xff) &&
             ((VVar1 != '\x03' ||
              ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))
             )) {
            pcVar6 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
            ;
            goto LAB_004c785b;
          }
          if (numparam != 3) {
            if (param[3].field_0.field_3.Type == '\0') {
              if (numparam == 4) {
                pcVar6 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
                  if ((uint)numparam < 6) {
                    pcVar6 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') {
                      if (*(player_t **)&this_00[0xc].ObjectFlags != (player_t *)0x0) {
                        uVar2 = param[4].field_0.i;
                        iVar3 = param[5].field_0.i;
                        pDVar5 = player_t::FindPSprite
                                           (*(player_t **)&this_00[0xc].ObjectFlags,
                                            param[3].field_0.i);
                        if (pDVar5 != (DPSprite *)0x0) {
                          if (iVar3 == 0) {
                            pDVar5->Flags = pDVar5->Flags & ~uVar2;
                          }
                          else {
                            pDVar5->Flags = pDVar5->Flags | uVar2;
                          }
                        }
                      }
                      return 0;
                    }
                    pcVar6 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar6,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                                ,0x408,
                                "int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                               );
                }
                pcVar6 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x407,
                            "int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            pcVar6 = "param[paramnum].Type == REGT_INT";
            goto LAB_004c77ec;
          }
        }
      }
      pcVar6 = "(paramnum) < numparam";
LAB_004c77ec:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x406,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if (this_00 == (DObject *)0x0) goto LAB_004c76e0;
  }
LAB_004c77d3:
  pcVar6 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004c785b:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_OverlayFlags)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT(layer);
	PARAM_INT(flags);
	PARAM_BOOL(set);

	if (self->player == nullptr)
		return 0;

	DPSprite *pspr = self->player->FindPSprite(layer);

	if (pspr == nullptr)
		return 0;

	if (set)
		pspr->Flags |= flags;
	else
		pspr->Flags &= ~flags;

	return 0;
}